

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rbuObjIterClearStatements(RbuObjIter *pIter)

{
  RbuUpdateStmt *pRVar1;
  RbuUpdateStmt *p;
  
  sqlite3_finalize(pIter->pSelect);
  sqlite3_finalize(pIter->pInsert);
  sqlite3_finalize(pIter->pDelete);
  sqlite3_finalize(pIter->pTmpInsert);
  p = pIter->pRbuUpdate;
  while (p != (RbuUpdateStmt *)0x0) {
    pRVar1 = p->pNext;
    sqlite3_finalize(p->pUpdate);
    sqlite3_free(p);
    p = pRVar1;
  }
  pIter->nCol = 0;
  pIter->pDelete = (sqlite3_stmt *)0x0;
  pIter->pTmpInsert = (sqlite3_stmt *)0x0;
  pIter->pSelect = (sqlite3_stmt *)0x0;
  pIter->pInsert = (sqlite3_stmt *)0x0;
  pIter->pRbuUpdate = (RbuUpdateStmt *)0x0;
  return;
}

Assistant:

static void rbuObjIterClearStatements(RbuObjIter *pIter){
  RbuUpdateStmt *pUp;

  sqlite3_finalize(pIter->pSelect);
  sqlite3_finalize(pIter->pInsert);
  sqlite3_finalize(pIter->pDelete);
  sqlite3_finalize(pIter->pTmpInsert);
  pUp = pIter->pRbuUpdate;
  while( pUp ){
    RbuUpdateStmt *pTmp = pUp->pNext;
    sqlite3_finalize(pUp->pUpdate);
    sqlite3_free(pUp);
    pUp = pTmp;
  }
  
  pIter->pSelect = 0;
  pIter->pInsert = 0;
  pIter->pDelete = 0;
  pIter->pRbuUpdate = 0;
  pIter->pTmpInsert = 0;
  pIter->nCol = 0;
}